

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_flattened_io_block_member
          (CompilerGLSL *this,string *basename,SPIRType *type,char *qual,
          SmallVector<unsigned_int,_8UL> *indices)

{
  uint index_00;
  uint32_t uVar1;
  TypedID<(spirv_cross::Types)1> TVar2;
  TypedID *this_00;
  uint *puVar3;
  string *psVar4;
  allocator local_131;
  string local_130 [36];
  uint32_t local_10c;
  undefined1 local_108 [8];
  string member_name;
  string local_e0 [8];
  string backup_name;
  undefined1 local_b8 [4];
  uint32_t last_index;
  uint *local_88;
  uint *index;
  uint *__end1;
  uint *__begin1;
  SmallVector<unsigned_int,_8UL> *__range1;
  string flattened_name;
  SPIRType *local_48;
  SPIRType *parent_type;
  SPIRType *member_type;
  uint32_t member_type_id;
  SmallVector<unsigned_int,_8UL> *indices_local;
  char *qual_local;
  SPIRType *type_local;
  string *basename_local;
  CompilerGLSL *this_local;
  
  member_type._4_4_ =
       TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  local_48 = (SPIRType *)0x0;
  ::std::__cxx11::string::string((string *)&__range1,(string *)basename);
  __begin1 = (uint *)indices;
  __end1 = VectorView<unsigned_int>::begin(&indices->super_VectorView<unsigned_int>);
  index = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)__begin1);
  parent_type = type;
  for (; __end1 != index; __end1 = __end1 + 1) {
    local_88 = __end1;
    ::std::__cxx11::string::operator+=((string *)&__range1,"_");
    to_member_name_abi_cxx11_((CompilerGLSL *)local_b8,(SPIRType *)this,(uint32_t)parent_type);
    ::std::__cxx11::string::operator+=((string *)&__range1,(string *)local_b8);
    ::std::__cxx11::string::~string((string *)local_b8);
    local_48 = parent_type;
    this_00 = (TypedID *)
              VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                        (&(parent_type->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                         (ulong)*local_88);
    member_type._4_4_ = TypedID::operator_cast_to_unsigned_int(this_00);
    parent_type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,member_type._4_4_);
  }
  if (*(int *)&(parent_type->super_IVariant).field_0xc != 0xf) {
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_48->type_alias);
    if (uVar1 != 0) {
      uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_48->type_alias);
      local_48 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar1);
    }
    ParsedIR::sanitize_underscores((string *)&__range1);
    puVar3 = VectorView<unsigned_int>::back(&indices->super_VectorView<unsigned_int>);
    index_00 = *puVar3;
    TVar2 = TypedID::operator_cast_to_TypedID((TypedID *)&(local_48->super_IVariant).self);
    psVar4 = Compiler::get_member_name_abi_cxx11_(&this->super_Compiler,(TypeID)TVar2.id,index_00);
    ::std::__cxx11::string::string(local_e0,(string *)psVar4);
    to_member_name_abi_cxx11_((CompilerGLSL *)local_108,(SPIRType *)this,(uint32_t)local_48);
    local_10c = (uint32_t)
                TypedID::operator_cast_to_TypedID((TypedID *)&(local_48->super_IVariant).self);
    Compiler::set_member_name(&this->super_Compiler,(TypeID)local_10c,index_00,(string *)&__range1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_130,qual,&local_131);
    (*(this->super_Compiler)._vptr_Compiler[0x15])
              (this,local_48,(ulong)member_type._4_4_,(ulong)index_00,local_130,0);
    ::std::__cxx11::string::~string(local_130);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_131);
    TVar2 = TypedID::operator_cast_to_TypedID((TypedID *)&(local_48->super_IVariant).self);
    Compiler::set_member_name(&this->super_Compiler,(TypeID)TVar2.id,index_00,(string *)local_108);
    ::std::__cxx11::string::~string((string *)local_108);
    ::std::__cxx11::string::~string(local_e0);
    ::std::__cxx11::string::~string((string *)&__range1);
    return;
  }
  __assert_fail("member_type->basetype != SPIRType::Struct",
                "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_glsl.cpp"
                ,0xa05,
                "void spirv_cross::CompilerGLSL::emit_flattened_io_block_member(const std::string &, const SPIRType &, const char *, const SmallVector<uint32_t> &)"
               );
}

Assistant:

void CompilerGLSL::emit_flattened_io_block_member(const std::string &basename, const SPIRType &type, const char *qual,
                                                  const SmallVector<uint32_t> &indices)
{
	uint32_t member_type_id = type.self;
	const SPIRType *member_type = &type;
	const SPIRType *parent_type = nullptr;
	auto flattened_name = basename;
	for (auto &index : indices)
	{
		flattened_name += "_";
		flattened_name += to_member_name(*member_type, index);
		parent_type = member_type;
		member_type_id = member_type->member_types[index];
		member_type = &get<SPIRType>(member_type_id);
	}

	assert(member_type->basetype != SPIRType::Struct);

	// We're overriding struct member names, so ensure we do so on the primary type.
	if (parent_type->type_alias)
		parent_type = &get<SPIRType>(parent_type->type_alias);

	// Sanitize underscores because joining the two identifiers might create more than 1 underscore in a row,
	// which is not allowed.
	ParsedIR::sanitize_underscores(flattened_name);

	uint32_t last_index = indices.back();

	// Pass in the varying qualifier here so it will appear in the correct declaration order.
	// Replace member name while emitting it so it encodes both struct name and member name.
	auto backup_name = get_member_name(parent_type->self, last_index);
	auto member_name = to_member_name(*parent_type, last_index);
	set_member_name(parent_type->self, last_index, flattened_name);
	emit_struct_member(*parent_type, member_type_id, last_index, qual);
	// Restore member name.
	set_member_name(parent_type->self, last_index, member_name);
}